

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AutoLoadExtensions(sqlite3 *db)

{
  bool bVar1;
  uint uVar2;
  int err_code;
  sqlite3_mutex *psVar3;
  code *pcVar4;
  uint uVar5;
  long lVar6;
  long in_FS_OFFSET;
  char *zErrmsg;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sqlite3Autoext_0 != 0) {
    lVar6 = 0;
    do {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      bVar1 = true;
      if ((sqlite3Config.bCoreMutex == '\0') ||
         (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
        psVar3 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar3);
        bVar1 = false;
      }
      uVar2 = sqlite3Autoext_0;
      uVar5 = (uint)lVar6;
      if (uVar5 < sqlite3Autoext_0) {
        pcVar4 = *(code **)(sqlite3Autoext_1 + lVar6 * 8);
      }
      else {
        pcVar4 = (code *)0x0;
      }
      if (!bVar1) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      local_40 = (undefined1 *)0x0;
      if ((pcVar4 != (code *)0x0) &&
         (err_code = (*pcVar4)(db,&local_40,&sqlite3Apis), err_code != 0)) {
        sqlite3ErrorWithMsg(db,err_code,"automatic extension loading failed: %s");
        sqlite3_free(local_40);
        break;
      }
      sqlite3_free(local_40);
      lVar6 = lVar6 + 1;
    } while (uVar5 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoLoadExtensions(sqlite3 *db){
  u32 i;
  int go = 1;
  int rc;
  sqlite3_loadext_entry xInit;

  wsdAutoextInit;
  if( wsdAutoext.nExt==0 ){
    /* Common case: early out without every having to acquire a mutex */
    return;
  }
  for(i=0; go; i++){
    char *zErrmsg;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
#ifdef SQLITE_OMIT_LOAD_EXTENSION
    const sqlite3_api_routines *pThunk = 0;
#else
    const sqlite3_api_routines *pThunk = &sqlite3Apis;
#endif
    sqlite3_mutex_enter(mutex);
    if( i>=wsdAutoext.nExt ){
      xInit = 0;
      go = 0;
    }else{
      xInit = (sqlite3_loadext_entry)wsdAutoext.aExt[i];
    }
    sqlite3_mutex_leave(mutex);
    zErrmsg = 0;
    if( xInit && (rc = xInit(db, &zErrmsg, pThunk))!=0 ){
      sqlite3ErrorWithMsg(db, rc,
            "automatic extension loading failed: %s", zErrmsg);
      go = 0;
    }
    sqlite3_free(zErrmsg);
  }
}